

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>,_void>
     ::serialize<OutputStream>
               (unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                *opt,OutputStream *ostream)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  if ((opt->_M_t).
      super___uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      .super__Head_base<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_false>._M_head_impl
      == (unique_ptr<int,_std::default_delete<int>_> *)0x0) {
    uStack_18 = in_RAX & 0xffffffffffffff;
    std::ostream::write((char *)(ostream->stream + 0x10),(long)&uStack_18 + 7);
  }
  else {
    uStack_18._7_1_ = (undefined1)(in_RAX >> 0x38);
    uStack_18._0_7_ = CONCAT16(1,(int6)in_RAX);
    std::ostream::write((char *)(ostream->stream + 0x10),(long)&uStack_18 + 6);
    BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
    serialize<OutputStream>
              ((opt->_M_t).
               super___uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               .super__Head_base<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_false>.
               _M_head_impl,ostream);
  }
  return;
}

Assistant:

static void serialize(const Optional& opt, OutputStream& ostream)
  {
    if (opt)
    {
      mserialize::serialize(std::uint8_t{1}, ostream);
      mserialize::serialize(*opt, ostream);
    }
    else
    {
      mserialize::serialize(std::uint8_t{0}, ostream);
    }
  }